

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlattenPass.cpp
# Opt level: O1

bool __thiscall Flatten::inlineFunction(Flatten *this,Function *F,Function *Caller)

{
  mapped_type pBVar1;
  mapped_type pBVar2;
  CallBase *this_00;
  iterator iVar3;
  char cVar4;
  LLVMContext *pLVar5;
  mapped_type pBVar6;
  mapped_type *ppBVar7;
  mapped_type *ppBVar8;
  CallBase *pCVar9;
  Value *pVVar10;
  FunctionType *this_01;
  Type *pTVar11;
  PHINode *this_02;
  UnreachableInst *this_03;
  SwitchInst *pSVar12;
  _Base_ptr p_Var13;
  FunctionPass *pFVar14;
  Function *pFVar15;
  long lVar16;
  mapped_type pBVar17;
  char *__function;
  Function *pFVar18;
  Function *pFVar19;
  CallInst **ppCVar20;
  Function *pFVar21;
  mapped_type pBVar22;
  Function *pFVar23;
  bool bVar24;
  bool bVar25;
  iterator_range<llvm::Argument_*> iVar26;
  ArrayRef<llvm::Value_*> Args;
  vector<llvm::CallInst_*,_std::allocator<llvm::CallInst_*>_> CallSites;
  BasicBlock *ParentBlock;
  vector<llvm::Value_*,_std::allocator<llvm::Value_*>_> CallArgs;
  map<llvm::Instruction_*,_llvm::BasicBlock_*,_std::less<llvm::Instruction_*>,_std::allocator<std::pair<llvm::Instruction_*const,_llvm::BasicBlock_*>_>_>
  CallSiteToOrigParent;
  map<llvm::BasicBlock_*,_llvm::BasicBlock_*,_std::less<llvm::BasicBlock_*>,_std::allocator<std::pair<llvm::BasicBlock_*const,_llvm::BasicBlock_*>_>_>
  CallSiteToRet;
  BasicBlock *in_stack_fffffffffffffd68;
  CallInst **local_288;
  iterator iStack_280;
  CallInst **local_278;
  Function *local_268;
  Twine *local_260;
  CallBase *local_258;
  Function *local_250;
  mapped_type local_248;
  Child local_240 [2];
  Value *local_218;
  long lStack_210;
  long local_208;
  Flatten *local_200;
  Argument *local_1f8;
  Argument *local_1f0;
  _Rb_tree<llvm::Instruction_*,_std::pair<llvm::Instruction_*const,_llvm::BasicBlock_*>,_std::_Select1st<std::pair<llvm::Instruction_*const,_llvm::BasicBlock_*>_>,_std::less<llvm::Instruction_*>,_std::allocator<std::pair<llvm::Instruction_*const,_llvm::BasicBlock_*>_>_>
  local_1e8;
  undefined1 local_1b8 [16];
  _Base_ptr local_1a8;
  _Base_ptr local_1a0;
  _Base_ptr p_Stack_198;
  BlockFrequencyInfo *local_190;
  undefined1 *local_188;
  undefined8 local_180;
  undefined1 local_178 [32];
  SmallVector<llvm::WeakTrackingVH,_8U> local_158;
  undefined1 *local_88;
  undefined8 local_80;
  undefined1 local_78 [64];
  bool local_38;
  
  local_200 = this;
  cVar4 = llvm::Function::hasFnAttribute((AttrKind)F);
  if ((cVar4 == '\0') && (cVar4 = llvm::GlobalValue::isDeclaration(), cVar4 == '\0')) {
    local_288 = (CallInst **)0x0;
    iStack_280._M_current = (CallInst **)0x0;
    local_278 = (CallInst **)0x0;
    local_250 = Caller + 0x48;
    pFVar19 = *(Function **)(Caller + 0x50);
    local_268 = F;
    if (pFVar19 != local_250) {
      do {
        pFVar23 = pFVar19 + -0x18;
        if (pFVar19 == (Function *)0x0) {
          pFVar23 = (Function *)0x0;
        }
        for (pFVar21 = *(Function **)(pFVar23 + 0x30); pFVar21 != pFVar23 + 0x28;
            pFVar21 = *(Function **)(pFVar21 + 8)) {
          if (pFVar21 == (Function *)0x0) {
            __function = 
            "static bool llvm::isa_impl_cl<llvm::CallInst, const llvm::Instruction *>::doit(const From *) [To = llvm::CallInst, From = const llvm::Instruction *]"
            ;
            goto LAB_00114f72;
          }
          local_1b8._0_8_ = pFVar21 + -0x18;
          pFVar18 = (Function *)0x0;
          if (pFVar21[-8] == (Function)0x53) {
            pFVar15 = *(Function **)(pFVar21 + -0x38);
            if (pFVar15 == (Function *)0x0) {
              __function = 
              "static bool llvm::isa_impl_cl<llvm::InlineAsm, const llvm::Value *>::doit(const From *) [To = llvm::InlineAsm, From = const llvm::Value *]"
              ;
              goto LAB_00114f72;
            }
            pFVar18 = (Function *)local_1b8._0_8_;
            if (pFVar15[0x10] != (Function)0x17) {
              if (pFVar15[0x10] != (Function)0x0) {
                pFVar15 = (Function *)0x0;
              }
              if ((pFVar15 == (Function *)0x0) ||
                 (*(long *)(pFVar15 + 0x18) != *(long *)(pFVar21 + 0x30))) {
                pFVar15 = (Function *)0x0;
              }
              if (pFVar15 == local_268) {
                if (iStack_280._M_current == local_278) {
                  std::vector<llvm::CallInst*,std::allocator<llvm::CallInst*>>::
                  _M_realloc_insert<llvm::CallInst*const&>
                            ((vector<llvm::CallInst*,std::allocator<llvm::CallInst*>> *)&local_288,
                             iStack_280,(CallInst **)local_1b8);
                  pFVar18 = (Function *)local_1b8._0_8_;
                }
                else {
                  *iStack_280._M_current = (CallInst *)local_1b8._0_8_;
                  iStack_280._M_current = iStack_280._M_current + 1;
                }
              }
            }
          }
          local_1b8._0_8_ = pFVar18;
        }
        pFVar19 = *(Function **)(pFVar19 + 8);
      } while (pFVar19 != local_250);
    }
    lVar16 = (long)iStack_280._M_current - (long)local_288 >> 3;
    if (lVar16 == 0) {
      pCVar9 = (CallBase *)0x0;
    }
    else if (lVar16 == 1) {
      pCVar9 = &(*local_288)->super_CallBase;
    }
    else {
      local_218 = (Value *)0x0;
      lStack_210 = 0;
      local_208 = 0;
      local_1a0 = (_Base_ptr)(local_1b8 + 8);
      local_1b8._8_8_ = local_1b8._8_8_ & 0xffffffff00000000;
      local_1a8 = (_Base_ptr)0x0;
      local_190 = (BlockFrequencyInfo *)0x0;
      local_1e8._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_1e8._M_impl.super__Rb_tree_header._M_header;
      local_1e8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_1e8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_1e8._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_1e8._M_impl.super__Rb_tree_header._M_header._M_right =
           local_1e8._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Stack_198 = local_1a0;
      pLVar5 = (LLVMContext *)llvm::Function::getContext();
      llvm::Twine::Twine((Twine *)&local_240[0].ptrAndLength,"");
      local_260 = (Twine *)llvm::BasicBlock::Create
                                     (pLVar5,(Twine *)&local_240[0].ptrAndLength,Caller,
                                      (BasicBlock *)0x0);
      iVar3._M_current = iStack_280._M_current;
      if (local_288 != iStack_280._M_current) {
        ppCVar20 = local_288;
        do {
          pCVar9 = &(*ppCVar20)->super_CallBase;
          pBVar1 = *(mapped_type *)&pCVar9->field_0x28;
          pBVar2 = *(mapped_type *)&pCVar9->field_0x20;
          local_248 = pBVar1;
          llvm::Twine::Twine((Twine *)&local_240[0].ptrAndLength,"");
          pBVar17 = pBVar2 + -0x18;
          if (pBVar2 == (mapped_type)0x0) {
            pBVar17 = (mapped_type)0x0;
          }
          pBVar22 = (mapped_type)0x0;
          if (pBVar2 != pBVar1 + 0x28) {
            pBVar22 = pBVar17;
          }
          pBVar6 = (mapped_type)llvm::BasicBlock::splitBasicBlock(pBVar1,pBVar22 + 0x18,local_240,0)
          ;
          pBVar17 = local_248;
          local_240[0]._0_8_ = pCVar9;
          ppBVar7 = std::
                    map<llvm::Instruction_*,_llvm::BasicBlock_*,_std::less<llvm::Instruction_*>,_std::allocator<std::pair<llvm::Instruction_*const,_llvm::BasicBlock_*>_>_>
                    ::operator[]((map<llvm::Instruction_*,_llvm::BasicBlock_*,_std::less<llvm::Instruction_*>,_std::allocator<std::pair<llvm::Instruction_*const,_llvm::BasicBlock_*>_>_>
                                  *)&local_1e8,(key_type *)&local_240[0].twine);
          *ppBVar7 = pBVar17;
          ppBVar8 = std::
                    map<llvm::BasicBlock_*,_llvm::BasicBlock_*,_std::less<llvm::BasicBlock_*>,_std::allocator<std::pair<llvm::BasicBlock_*const,_llvm::BasicBlock_*>_>_>
                    ::operator[]((map<llvm::BasicBlock_*,_llvm::BasicBlock_*,_std::less<llvm::BasicBlock_*>,_std::allocator<std::pair<llvm::BasicBlock_*const,_llvm::BasicBlock_*>_>_>
                                  *)local_1b8,&local_248);
          *ppBVar8 = pBVar6;
          llvm::BasicBlock::getFirstNonPHI();
          llvm::Instruction::moveBefore(&pCVar9->super_Instruction);
          llvm::BranchInst::Create((BasicBlock *)local_260,local_248);
          llvm::Instruction::eraseFromParent();
          ppCVar20 = ppCVar20 + 1;
        } while (ppCVar20 != iVar3._M_current);
      }
      if ((*(long *)(local_268 + 0x60) != 0) &&
         (iVar26 = llvm::Function::args(local_268), iVar26.begin_iterator != iVar26.end_iterator)) {
        local_258 = (CallBase *)((ulong)local_258 & 0xffffffff00000000);
        do {
          iVar3._M_current = iStack_280._M_current;
          ppCVar20 = local_288;
          local_1f8 = iVar26.end_iterator;
          local_1f0 = iVar26.begin_iterator;
          pTVar11 = *(Type **)local_1f0;
          llvm::Twine::Twine((Twine *)&local_240[0].ptrAndLength,"");
          pCVar9 = (CallBase *)
                   llvm::PHINode::Create
                             (pTVar11,(uint)((ulong)((long)iVar3._M_current - (long)ppCVar20) >> 3),
                              (Twine *)&local_240[0].ptrAndLength,(BasicBlock *)local_260);
          iVar3._M_current = iStack_280._M_current;
          for (ppCVar20 = local_288; ppCVar20 != iVar3._M_current; ppCVar20 = ppCVar20 + 1) {
            this_00 = &(*ppCVar20)->super_CallBase;
            pVVar10 = llvm::CallBase::getArgOperand(this_00,(uint)local_258);
            local_240[0]._0_8_ = this_00;
            ppBVar7 = std::
                      map<llvm::Instruction_*,_llvm::BasicBlock_*,_std::less<llvm::Instruction_*>,_std::allocator<std::pair<llvm::Instruction_*const,_llvm::BasicBlock_*>_>_>
                      ::operator[]((map<llvm::Instruction_*,_llvm::BasicBlock_*,_std::less<llvm::Instruction_*>,_std::allocator<std::pair<llvm::Instruction_*const,_llvm::BasicBlock_*>_>_>
                                    *)&local_1e8,(key_type *)&local_240[0].twine);
            llvm::PHINode::addIncoming((PHINode *)pCVar9,pVVar10,*ppBVar7);
          }
          if (pCVar9 == (CallBase *)0x0) {
            __function = 
            "static bool llvm::isa_impl_cl<llvm::Value, const llvm::PHINode *>::doit(const From *) [To = llvm::Value, From = const llvm::PHINode *]"
            ;
LAB_00114f72:
            __assert_fail("Val && \"isa<> used on a null pointer\"",
                          "/usr/lib/llvm-14/include/llvm/Support/Casting.h",0x68,__function);
          }
          local_240[0]._0_8_ = pCVar9;
          std::vector<llvm::Value*,std::allocator<llvm::Value*>>::emplace_back<llvm::Value*>
                    ((vector<llvm::Value*,std::allocator<llvm::Value*>> *)&local_218,
                     (Value **)&local_240[0].twine);
          local_258 = (CallBase *)CONCAT44(local_258._4_4_,(uint)local_258 + 1);
          iVar26.end_iterator = local_1f8;
          iVar26.begin_iterator = local_1f0 + 0x28;
        } while (local_1f0 + 0x28 != local_1f8);
      }
      pFVar19 = local_268;
      this_01 = llvm::Function::getFunctionType(local_268);
      lVar16 = lStack_210;
      pVVar10 = local_218;
      llvm::Twine::Twine((Twine *)&local_240[0].ptrAndLength,"");
      Args.Length = (size_type)local_240;
      Args.Data = (Value **)(lVar16 - (long)pVVar10 >> 3);
      pCVar9 = &llvm::CallInst::Create
                          ((CallInst *)this_01,(FunctionType *)pFVar19,pVVar10,Args,local_260,
                           in_stack_fffffffffffffd68)->super_CallBase;
      iVar3._M_current = iStack_280._M_current;
      for (ppCVar20 = local_288; ppCVar20 != iVar3._M_current; ppCVar20 = ppCVar20 + 1) {
        llvm::Value::replaceAllUsesWith((Value *)*ppCVar20);
        llvm::Instruction::eraseFromParent();
      }
      pLVar5 = (LLVMContext *)llvm::Function::getContext();
      pTVar11 = (Type *)llvm::Type::getInt32Ty(pLVar5);
      iVar3._M_current = iStack_280._M_current;
      ppCVar20 = local_288;
      llvm::Twine::Twine((Twine *)&local_240[0].ptrAndLength,"");
      pFVar23 = (Function *)((ulong)((long)iVar3._M_current - (long)ppCVar20) >> 3);
      this_02 = llvm::PHINode::Create
                          (pTVar11,(uint)pFVar23,(Twine *)&local_240[0].ptrAndLength,
                           &pCVar9->super_Instruction);
      pFVar19 = *(Function **)(Caller + 0x50);
      bVar25 = pFVar19 == local_250;
      while (!bVar25) {
        pFVar21 = pFVar19 + -0x18;
        if (pFVar19 == (Function *)0x0) {
          pFVar21 = (Function *)0x0;
        }
        pFVar18 = *(Function **)(pFVar21 + 0x30);
        bVar24 = true;
        if (pFVar18 != pFVar21 + 0x28) {
          lVar16 = 1;
          do {
            pFVar18 = *(Function **)(pFVar18 + 8);
            lVar16 = lVar16 + -1;
          } while (pFVar18 != pFVar21 + 0x28);
          if (lVar16 == 0) {
            lVar16 = llvm::BasicBlock::getFirstNonPHI();
            if (lVar16 == 0) {
              __assert_fail("instr && \"basic block contains no non-phi instructions\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/SheLLVM[P]SheLLVM/llvm/MergeCallsPass.h"
                            ,0x1e,
                            "static BasicBlock *(anonymous namespace)::MergeCalls::getUnreachableBlock(Function *)"
                           );
            }
            bVar24 = *(char *)(lVar16 + 0x10) != '\"';
            if (!bVar24) {
              pFVar23 = pFVar21;
            }
          }
        }
        if (!bVar24) break;
        pFVar19 = *(Function **)(pFVar19 + 8);
        bVar25 = pFVar19 == local_250;
      }
      if (bVar25) {
        pLVar5 = (LLVMContext *)llvm::Function::getContext();
        llvm::Twine::Twine((Twine *)&local_240[0].ptrAndLength,"");
        pFVar23 = (Function *)
                  llvm::BasicBlock::Create
                            (pLVar5,(Twine *)&local_240[0].ptrAndLength,Caller,(BasicBlock *)0x0);
        this_03 = (UnreachableInst *)llvm::User::operator_new(0x40,0);
        pLVar5 = (LLVMContext *)llvm::Function::getContext();
        llvm::UnreachableInst::UnreachableInst(this_03,pLVar5,(BasicBlock *)pFVar23);
      }
      pSVar12 = llvm::SwitchInst::Create
                          ((Value *)this_02,(BasicBlock *)pFVar23,(uint)local_190,
                           (BasicBlock *)local_260);
      local_258 = pCVar9;
      if (local_1a0 != (_Rb_tree_node_base *)(local_1b8 + 8)) {
        pCVar9 = (CallBase *)0x0;
        p_Var13 = local_1a0;
        do {
          pLVar5 = (LLVMContext *)llvm::Function::getContext();
          local_240[0].ptrAndLength.length._0_4_ = 0x20;
          local_240[0]._0_8_ = pCVar9;
          pVVar10 = (Value *)llvm::ConstantInt::get(pLVar5,(APInt *)&local_240[0].ptrAndLength);
          if ((0x40 < (uint)local_240[0]._8_4_) &&
             ((CallBase *)local_240[0]._0_8_ != (CallBase *)0x0)) {
            operator_delete__((void *)local_240[0]._0_8_);
          }
          llvm::PHINode::addIncoming(this_02,pVVar10,*(BasicBlock **)(p_Var13 + 1));
          llvm::SwitchInst::addCase((ConstantInt *)pSVar12,(BasicBlock *)pVVar10);
          p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13);
          pCVar9 = (CallBase *)&pCVar9->field_0x1;
        } while (p_Var13 != (_Rb_tree_node_base *)(local_1b8 + 8));
      }
      std::
      _Rb_tree<llvm::Instruction_*,_std::pair<llvm::Instruction_*const,_llvm::BasicBlock_*>,_std::_Select1st<std::pair<llvm::Instruction_*const,_llvm::BasicBlock_*>_>,_std::less<llvm::Instruction_*>,_std::allocator<std::pair<llvm::Instruction_*const,_llvm::BasicBlock_*>_>_>
      ::~_Rb_tree(&local_1e8);
      std::
      _Rb_tree<llvm::BasicBlock_*,_std::pair<llvm::BasicBlock_*const,_llvm::BasicBlock_*>,_std::_Select1st<std::pair<llvm::BasicBlock_*const,_llvm::BasicBlock_*>_>,_std::less<llvm::BasicBlock_*>,_std::allocator<std::pair<llvm::BasicBlock_*const,_llvm::BasicBlock_*>_>_>
      ::~_Rb_tree((_Rb_tree<llvm::BasicBlock_*,_std::pair<llvm::BasicBlock_*const,_llvm::BasicBlock_*>,_std::_Select1st<std::pair<llvm::BasicBlock_*const,_llvm::BasicBlock_*>_>,_std::less<llvm::BasicBlock_*>,_std::allocator<std::pair<llvm::BasicBlock_*const,_llvm::BasicBlock_*>_>_>
                   *)local_1b8);
      pCVar9 = local_258;
      if (local_218 != (Value *)0x0) {
        operator_delete(local_218,local_208 - (long)local_218);
        pCVar9 = local_258;
      }
    }
    if (local_288 != (CallInst **)0x0) {
      operator_delete(local_288,(long)local_278 - (long)local_288);
    }
    if (pCVar9 == (CallBase *)0x0) {
      __assert_fail("CallSite && \"MergeCalls did not return a unified callsite\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/SheLLVM[P]SheLLVM/llvm/FlattenPass.cpp"
                    ,0x23,"bool Flatten::inlineFunction(Function *, Function *)");
    }
    if (local_200->reg2mem == (FunctionPass *)0x0) {
      pFVar14 = (FunctionPass *)llvm::createDemoteRegisterToMemoryPass();
      local_200->reg2mem = pFVar14;
    }
    (**(code **)(*(long *)local_200->reg2mem + 0x88))(local_200->reg2mem,Caller);
    local_1b8._0_8_ = (CallGraph *)0x0;
    local_1b8._8_8_ = (_func_AssumptionCache_ptr_intptr_t_Function_ptr *)0x0;
    local_1a0 = (_Base_ptr)0x0;
    p_Stack_198 = (_Base_ptr)0x0;
    local_190 = (BlockFrequencyInfo *)0x0;
    local_180._0_4_ = 0;
    local_180._4_4_ = 4;
    local_158.super_SmallVectorImpl<llvm::WeakTrackingVH>.
    super_SmallVectorTemplateBase<llvm::WeakTrackingVH,_false>.
    super_SmallVectorTemplateCommon<llvm::WeakTrackingVH,_void>.super_SmallVectorBase<unsigned_int>.
    BeginX = &local_158.super_SmallVectorStorage<llvm::WeakTrackingVH,_8U>;
    local_158.super_SmallVectorImpl<llvm::WeakTrackingVH>.
    super_SmallVectorTemplateBase<llvm::WeakTrackingVH,_false>.
    super_SmallVectorTemplateCommon<llvm::WeakTrackingVH,_void>.super_SmallVectorBase<unsigned_int>.
    Size = 0;
    local_158.super_SmallVectorImpl<llvm::WeakTrackingVH>.
    super_SmallVectorTemplateBase<llvm::WeakTrackingVH,_false>.
    super_SmallVectorTemplateCommon<llvm::WeakTrackingVH,_void>.super_SmallVectorBase<unsigned_int>.
    Capacity = 8;
    local_80._0_4_ = 0;
    local_80._4_4_ = 8;
    local_38 = true;
    local_188 = local_178;
    local_88 = local_78;
    lVar16 = llvm::InlineFunction
                       (pCVar9,(InlineFunctionInfo *)local_1b8,(AAResults *)0x0,true,(Function *)0x0
                       );
    bVar25 = lVar16 == 0;
    if ((bVar25) && (cVar4 = llvm::Function::isDefTriviallyDead(), cVar4 != '\0')) {
      llvm::Function::eraseFromParent();
    }
    if (local_88 != local_78) {
      free(local_88);
    }
    llvm::SmallVector<llvm::WeakTrackingVH,_8U>::~SmallVector(&local_158);
    if (local_188 != local_178) {
      free(local_188);
    }
  }
  else {
    bVar25 = false;
  }
  return bVar25;
}

Assistant:

bool Flatten::inlineFunction(Function *F, Function *Caller) {
  if (F->hasFnAttribute(Attribute::NoInline)) {
    // Function not eligible for inlining. Bail out.
    return false;
  }

  if (F->isDeclaration()) {
    // Function is declared, and not defined. Bail out.
    return false;
  }

  // First, run the MergeCalls pass on it:
  CallInst *CallSite = MergeCalls::mergeCallSites(Caller, F);
  assert(CallSite && "MergeCalls did not return a unified callsite");

  if (reg2mem == nullptr)
    reg2mem = llvm::createDemoteRegisterToMemoryPass();
  reg2mem->runOnFunction(*Caller);

  // Coerce LLVM to inline the function.
  InlineFunctionInfo IFI;
  if (!InlineFunction(cast<CallBase>(*CallSite), IFI).isSuccess()) {
    return false;
  }

  // If F is now completely dead, we can erase it from the module.
  if (F->isDefTriviallyDead()) {
    F->eraseFromParent();
  }

  return true;
}